

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

void __thiscall serial::Serial::SerialImpl::sendBreak(SerialImpl *this,int duration)

{
  int iVar1;
  PortNotOpenedException *this_00;
  
  if (this->is_open_ != false) {
    iVar1 = duration + 3;
    if (-1 < duration) {
      iVar1 = duration;
    }
    tcsendbreak(this->fd_,iVar1 >> 2);
    return;
  }
  this_00 = (PortNotOpenedException *)__cxa_allocate_exception(0x28);
  PortNotOpenedException::PortNotOpenedException(this_00,"Serial::sendBreak");
  __cxa_throw(this_00,&PortNotOpenedException::typeinfo,
              PortNotOpenedException::~PortNotOpenedException);
}

Assistant:

void
Serial::SerialImpl::sendBreak (int duration)
{
  if (is_open_ == false) {
    throw PortNotOpenedException ("Serial::sendBreak");
  }
  tcsendbreak (fd_, static_cast<int> (duration / 4));
}